

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined8 in_RAX;
  GLFWmonitor **ppGVar5;
  undefined8 *puVar6;
  GLFWwindow *pGVar7;
  GLFWmonitor *monitor;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uStack_38;
  int monitor_count;
  
  bVar2 = false;
  uStack_38 = in_RAX;
  bVar3 = 0;
  while( true ) {
    do {
      bVar1 = bVar3;
      iVar4 = getopt(argc,argv,"afhn");
      bVar3 = 1;
    } while (iVar4 == 0x61);
    if (iVar4 != 0x66) break;
    bVar2 = true;
    bVar3 = bVar1;
  }
  if (iVar4 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar4 = glfwInit();
    if (iVar4 != 0) {
      if ((bool)(bVar1 & bVar2)) {
        ppGVar5 = glfwGetMonitors(&monitor_count);
        uVar9 = monitor_count;
        puVar6 = (undefined8 *)calloc((long)monitor_count,8);
        iVar4 = uVar9;
        for (lVar12 = 0; lVar12 < iVar4; lVar12 = lVar12 + 1) {
          pGVar7 = create_window(ppGVar5[lVar12]);
          puVar6[lVar12] = pGVar7;
          iVar4 = monitor_count;
        }
      }
      else {
        if (bVar2) {
          monitor = glfwGetPrimaryMonitor();
        }
        else {
          monitor = (GLFWmonitor *)0x0;
        }
        puVar6 = (undefined8 *)calloc(1,8);
        pGVar7 = create_window(monitor);
        *puVar6 = pGVar7;
        uVar9 = 1;
      }
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        glfwSetKeyCallback((GLFWwindow *)puVar6[uVar11],key_callback);
        glfwSetFramebufferSizeCallback((GLFWwindow *)puVar6[uVar11],framebuffer_size_callback);
        glfwSetWindowSizeCallback((GLFWwindow *)puVar6[uVar11],window_size_callback);
        glfwSetWindowFocusCallback((GLFWwindow *)puVar6[uVar11],window_focus_callback);
        glfwSetWindowIconifyCallback((GLFWwindow *)puVar6[uVar11],window_iconify_callback);
        glfwSetWindowMaximizeCallback((GLFWwindow *)puVar6[uVar11],window_maximize_callback);
        glfwSetWindowRefreshCallback((GLFWwindow *)puVar6[uVar11],window_refresh_callback);
        window_refresh_callback((GLFWwindow *)puVar6[uVar11]);
        iVar4 = glfwGetWindowAttrib((GLFWwindow *)puVar6[uVar11],0x20002);
        pcVar10 = "iconified";
        if (iVar4 == 0) {
          pcVar10 = "restored";
        }
        iVar4 = glfwGetWindowAttrib((GLFWwindow *)puVar6[uVar11],0x20001);
        pcVar8 = "focused";
        if (iVar4 == 0) {
          pcVar8 = "defocused";
        }
        printf("Window is %s and %s\n",pcVar10,pcVar8);
      }
      do {
        glfwWaitEvents();
        uVar11 = 0;
        while (uVar9 != uVar11) {
          iVar4 = glfwWindowShouldClose((GLFWwindow *)puVar6[uVar11]);
          uVar11 = uVar11 + 1;
          if (iVar4 != 0) {
            glfwTerminate();
            goto LAB_00110d7a;
          }
        }
        fflush(_stdout);
      } while( true );
    }
  }
  else {
    if (iVar4 == 0x68) {
      usage();
LAB_00110d7a:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    int fullscreen = GLFW_FALSE, all_monitors = GLFW_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GLFW_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowMaximizeCallback(windows[i], window_maximize_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwWaitEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}